

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InterfaceValidators.cpp
# Opt level: O0

Result * CoreML::validateClassifierFeatureDescriptions_<CoreML::Specification::FunctionDescription>
                   (Result *__return_storage_ptr__,FunctionDescription *interface,
                   bool expected_class_is_int64)

{
  initializer_list<CoreML::Specification::FeatureType::TypeCase> __l;
  initializer_list<CoreML::Specification::FeatureType::TypeCase> __l_00;
  string *psVar1;
  bool bVar2;
  ulong uVar3;
  CoreML *pCVar4;
  vector<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
  *in_R8;
  allocator<CoreML::Specification::FeatureType::TypeCase> local_d9;
  TypeCase local_d8 [2];
  iterator local_d0;
  size_type local_c8;
  string local_c0;
  allocator<CoreML::Specification::FeatureType::TypeCase> local_9d;
  TypeCase local_9c;
  iterator local_98;
  size_type local_90;
  string local_88;
  TypeCase local_68;
  TypeCase expected_class;
  allocator<char> local_51;
  string local_50;
  string *local_30;
  string *probOutputName;
  string *predictedFeatureName;
  FunctionDescription *pFStack_18;
  bool expected_class_is_int64_local;
  FunctionDescription *interface_local;
  Result *result;
  
  predictedFeatureName._7_1_ = expected_class_is_int64;
  pFStack_18 = interface;
  interface_local = (FunctionDescription *)__return_storage_ptr__;
  probOutputName = Specification::FunctionDescription::predictedfeaturename_abi_cxx11_(interface);
  local_30 = Specification::FunctionDescription::predictedprobabilitiesname_abi_cxx11_(pFStack_18);
  uVar3 = std::__cxx11::string::empty();
  if ((uVar3 & 1) == 0) {
    local_68 = ((byte)~predictedFeatureName._7_1_ & 1) * 2 + kInt64Type;
    local_88.field_2._M_local_buf[0xf] = 0;
    pCVar4 = (CoreML *)Specification::FunctionDescription::output(pFStack_18);
    psVar1 = probOutputName;
    local_9c = local_68;
    local_98 = &local_9c;
    local_90 = 1;
    std::allocator<CoreML::Specification::FeatureType::TypeCase>::allocator(&local_9d);
    __l_00._M_len = local_90;
    __l_00._M_array = local_98;
    std::
    vector<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
    ::vector((vector<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
              *)&local_88,__l_00,&local_9d);
    validateDescriptionsContainFeatureWithNameAndType<google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>>
              (__return_storage_ptr__,pCVar4,
               (RepeatedPtrField<CoreML::Specification::FeatureDescription> *)psVar1,&local_88,in_R8
              );
    std::
    vector<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
    ::~vector((vector<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
               *)&local_88);
    std::allocator<CoreML::Specification::FeatureType::TypeCase>::~allocator(&local_9d);
    bVar2 = Result::good(__return_storage_ptr__);
    if (!bVar2) {
      local_88.field_2._M_local_buf[0xf] = 1;
    }
    local_c0.field_2._13_3_ = 0;
    local_c0.field_2._M_local_buf[0xc] = !bVar2;
    if ((local_88.field_2._M_local_buf[0xf] & 1U) == 0) {
      Result::~Result(__return_storage_ptr__);
    }
    if (local_c0.field_2._12_4_ == 0) {
      uVar3 = std::__cxx11::string::empty();
      if ((uVar3 & 1) == 0) {
        local_c0.field_2._M_local_buf[0xb] = 0;
        pCVar4 = (CoreML *)Specification::FunctionDescription::output(pFStack_18);
        psVar1 = local_30;
        local_d8[0] = kMultiArrayType;
        local_d8[1] = 6;
        local_d0 = local_d8;
        local_c8 = 2;
        std::allocator<CoreML::Specification::FeatureType::TypeCase>::allocator(&local_d9);
        __l._M_len = local_c8;
        __l._M_array = local_d0;
        std::
        vector<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
        ::vector((vector<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
                  *)&local_c0,__l,&local_d9);
        validateDescriptionsContainFeatureWithNameAndType<google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>>
                  (__return_storage_ptr__,pCVar4,
                   (RepeatedPtrField<CoreML::Specification::FeatureDescription> *)psVar1,&local_c0,
                   in_R8);
        std::
        vector<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
        ::~vector((vector<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
                   *)&local_c0);
        std::allocator<CoreML::Specification::FeatureType::TypeCase>::~allocator(&local_d9);
        bVar2 = Result::good(__return_storage_ptr__);
        if (!bVar2) {
          local_c0.field_2._M_local_buf[0xb] = 1;
        }
        local_c0.field_2._13_3_ = 0;
        local_c0.field_2._M_local_buf[0xc] = !bVar2;
        if ((local_c0.field_2._M_local_buf[0xb] & 1U) == 0) {
          Result::~Result(__return_storage_ptr__);
        }
        if (local_c0.field_2._12_4_ != 0) {
          return __return_storage_ptr__;
        }
      }
      Result::Result(__return_storage_ptr__);
    }
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_50,"Specification is missing classifier predictedFeatureName",
               &local_51);
    Result::Result(__return_storage_ptr__,INVALID_MODEL_INTERFACE,&local_50);
    std::__cxx11::string::~string((string *)&local_50);
    std::allocator<char>::~allocator(&local_51);
  }
  return __return_storage_ptr__;
}

Assistant:

inline Result validateClassifierFeatureDescriptions_(const Description& interface,
                                                         bool expected_class_is_int64) {

        const auto& predictedFeatureName = interface.predictedfeaturename();
        const auto& probOutputName = interface.predictedprobabilitiesname();

        if (predictedFeatureName.empty()) {
            return Result(ResultType::INVALID_MODEL_INTERFACE,
                          "Specification is missing classifier predictedFeatureName");
        } else {
            auto expected_class = (expected_class_is_int64
                                   ? Specification::FeatureType::TypeCase::kInt64Type
                                   : Specification::FeatureType::TypeCase::kStringType);

            auto result = validateDescriptionsContainFeatureWithNameAndType(interface.output(),
                                                                            predictedFeatureName,
                                                                            {expected_class});
            if (!result.good()) {
                return result;
            }
        }

        if (!probOutputName.empty()) {
            // TODO @znation: validate array length below
            // and value type (must be double? different for different classifiers?)
            // TODO Probability outputs are always dictionaries!
            auto result = validateDescriptionsContainFeatureWithNameAndType(interface.output(),
                                                                            probOutputName,
                                                                            {Specification::FeatureType::TypeCase::kMultiArrayType, // TODO ARRAY TYPE IS INVALID, REMOVE
                                                                            Specification::FeatureType::TypeCase::kDictionaryType});
            if (!result.good()) {
                return result;
            }
        }

        return Result();
    }